

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_protozero::const_fixed_iterator<unsigned_int>_&,_const_protozero::const_fixed_iterator<unsigned_int>_&>
::streamReconstructedExpression
          (BinaryExpr<const_protozero::const_fixed_iterator<unsigned_int>_&,_const_protozero::const_fixed_iterator<unsigned_int>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,(string *)Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  std::__cxx11::string::string(local_60,(string *)Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_40,lhs,op,in_R9);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }